

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_object.hpp
# Opt level: O3

void __thiscall
jsoncons::
index_key_value<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>>::
index_key_value<jsoncons::byte_string_arg_t_const&,jsoncons::byte_string_view_const&,unsigned_long&>
          (index_key_value<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>>
           *this,key_type *Name,int64_t Index,byte_string_arg_t *args,byte_string_view *args_1,
          unsigned_long *args_2)

{
  pointer phVar1;
  allocator<char> local_21;
  
  std::__cxx11::wstring::wstring((wstring *)this,(wstring *)Name);
  *(int64_t *)(this + 0x20) = Index;
  phVar1 = utility::heap_string_factory<unsigned_char,_unsigned_long,_std::allocator<char>_>::create
                     (args_1->data_,args_1->size_,*args_2,&local_21);
  *(undefined2 *)(this + 0x28) = 0x120c;
  *(pointer *)(this + 0x30) = phVar1;
  return;
}

Assistant:

index_key_value(key_type&& Name, int64_t Index, Args&& ... args) 
            : name(std::move(Name)), index(Index), value(std::forward<Args>(args)...)
        {
        }